

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

bool S_GetSoundPlayingInfo(FPolyObj *poly,int sound_id)

{
  FSoundChan *pFVar1;
  
  pFVar1 = Channels;
  if (0 < sound_id) {
    for (; pFVar1 != (FSoundChan *)0x0; pFVar1 = pFVar1->NextChan) {
      if ((((pFVar1->OrgID).ID == sound_id) && (pFVar1->SourceType == '\x03')) &&
         ((pFVar1->field_12).Actor == (AActor *)poly)) {
        if (pFVar1 == (FSoundChan *)0x0) {
          return false;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool S_GetSoundPlayingInfo (const FPolyObj *poly, int sound_id)
{
	if (sound_id > 0)
	{
		for (FSoundChan *chan = Channels; chan != NULL; chan = chan->NextChan)
		{
			if (chan->OrgID == sound_id &&
				chan->SourceType == SOURCE_Polyobj &&
				chan->Poly == poly)
			{
				return true;
			}
		}
	}
	return false;
}